

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

double wabt::interp::FloatMax<double>(double lhs,double rhs)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  double local_30;
  byte local_21;
  double local_20;
  double rhs_local;
  double lhs_local;
  
  local_20 = rhs;
  rhs_local = lhs;
  uVar2 = std::isnan(lhs);
  local_21 = 1;
  if ((uVar2 & 1) == 0) {
    iVar3 = std::isnan(local_20);
    local_21 = (byte)iVar3;
  }
  if ((local_21 & 1) == 0) {
    bVar1 = false;
    if ((rhs_local == 0.0) && (!NAN(rhs_local))) {
      bVar1 = local_20 == 0.0;
    }
    if (bVar1) {
      bVar1 = std::signbit(rhs_local);
      if (bVar1) {
        local_30 = local_20;
      }
      else {
        local_30 = rhs_local;
      }
      lhs_local = local_30;
    }
    else {
      pdVar4 = std::max<double>(&rhs_local,&local_20);
      lhs_local = *pdVar4;
    }
  }
  else {
    lhs_local = std::numeric_limits<double>::quiet_NaN();
  }
  return lhs_local;
}

Assistant:

T WABT_VECTORCALL FloatMax(T lhs, T rhs) {
  if (WABT_UNLIKELY(std::isnan(lhs) || std::isnan(rhs))) {
    return std::numeric_limits<T>::quiet_NaN();
  } else if (WABT_UNLIKELY(lhs == 0 && rhs == 0)) {
    return std::signbit(lhs) ? rhs : lhs;
  } else {
    return std::max(lhs, rhs);
  }
}